

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

void mpc_input_unmark(mpc_input_t *i)

{
  void *pvVar1;
  size_t sVar2;
  int *in_RDI;
  int j;
  int local_14;
  int local_c;
  
  if (0 < in_RDI[0x13]) {
    in_RDI[0x15] = in_RDI[0x15] + -1;
    if ((in_RDI[0x15] + in_RDI[0x15] / 2 < in_RDI[0x14]) && (0x20 < in_RDI[0x14])) {
      if (in_RDI[0x15] < 0x21) {
        local_14 = 0x20;
      }
      else {
        local_14 = in_RDI[0x15];
      }
      in_RDI[0x14] = local_14;
      pvVar1 = realloc(*(void **)(in_RDI + 0x16),(long)in_RDI[0x14] << 5);
      *(void **)(in_RDI + 0x16) = pvVar1;
      pvVar1 = realloc(*(void **)(in_RDI + 0x18),(long)in_RDI[0x14]);
      *(void **)(in_RDI + 0x18) = pvVar1;
    }
    if ((*in_RDI == 2) && (in_RDI[0x15] == 0)) {
      sVar2 = strlen(*(char **)(in_RDI + 0xe));
      local_c = (int)sVar2;
      while (local_c = local_c + -1, -1 < local_c) {
        ungetc((int)*(char *)(*(long *)(in_RDI + 0xe) + (long)local_c),*(FILE **)(in_RDI + 0x10));
      }
      free(*(void **)(in_RDI + 0xe));
      in_RDI[0xe] = 0;
      in_RDI[0xf] = 0;
    }
  }
  return;
}

Assistant:

static void mpc_input_unmark(mpc_input_t *i) {
  int j;

  if (i->backtrack < 1) { return; }

  i->marks_num--;

  if (i->marks_slots > i->marks_num + i->marks_num / 2
  &&  i->marks_slots > MPC_INPUT_MARKS_MIN) {
    i->marks_slots =
      i->marks_num > MPC_INPUT_MARKS_MIN ?
      i->marks_num : MPC_INPUT_MARKS_MIN;
    i->marks = realloc(i->marks, sizeof(mpc_state_t) * i->marks_slots);
    i->lasts = realloc(i->lasts, sizeof(char) * i->marks_slots);
  }

  if (i->type == MPC_INPUT_PIPE && i->marks_num == 0) {
    for (j = strlen(i->buffer) - 1; j >= 0; j--)
      ungetc(i->buffer[j], i->file);

    free(i->buffer);
    i->buffer = NULL;
  }

}